

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O0

void __thiscall
dynet::LogSoftmax::backward_dev_impl<dynet::Device_CPU>
          (LogSoftmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  const_reference ppTVar1;
  reference pvVar2;
  Dim *in_RCX;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  DefaultDevice *in_RDI;
  double __x;
  array<int,_3> morph;
  array<int,_3> bcast;
  array<int,_1> red_axis;
  Tensor z;
  undefined4 in_stack_fffffffffffffca0;
  DeviceMempool in_stack_fffffffffffffca4;
  Device *in_stack_fffffffffffffca8;
  Tensor *in_stack_fffffffffffffcb0;
  Dim *in_stack_fffffffffffffcb8;
  Tensor *this_00;
  undefined1 in_stack_fffffffffffffcc0 [16];
  TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_3UL>,_const_Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_fffffffffffffd78;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffd80;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
  local_258 [228];
  uint in_stack_fffffffffffffe8c;
  Dim *in_stack_fffffffffffffe90;
  initializer_list<unsigned_int> in_stack_fffffffffffffe98;
  uint local_ac;
  uint *local_a8;
  undefined8 local_a0;
  Dim local_70 [2];
  Dim *local_20;
  
  local_20 = in_RCX;
  ppTVar1 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (in_RDX,0);
  local_ac = Dim::cols(&(*ppTVar1)->d);
  local_a8 = &local_ac;
  local_a0 = 1;
  Dim::Dim(in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,in_stack_fffffffffffffe8c);
  Tensor::Tensor(in_stack_fffffffffffffcc0._0_8_,in_stack_fffffffffffffcb8,
                 (float *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                 in_stack_fffffffffffffca4);
  pvVar2 = std::array<int,_1UL>::operator[]
                     ((array<int,_1UL> *)
                      CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (size_type)in_RDI);
  *pvVar2 = 0;
  Tensor::tb<2>(in_stack_fffffffffffffcc0._0_8_);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,0>::
  sum<std::array<int,1ul>>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
              *)in_stack_fffffffffffffcb0,(array<int,_1UL> *)in_stack_fffffffffffffca8);
  Tensor::tb<1>(in_stack_fffffffffffffcb0);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),in_RDI);
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
               *)in_stack_fffffffffffffcb0,
              (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>
               *)in_stack_fffffffffffffca8);
  Dim::rows(local_20);
  Dim::operator[](local_70,0);
  Tensor::tb<2>(in_stack_fffffffffffffcc0._0_8_);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>::
  exp(local_258,__x);
  Tensor::tvec((Tensor *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
  reshape<std::array<int,3ul>>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)in_stack_fffffffffffffcb0,(array<int,_3UL> *)in_stack_fffffffffffffca8);
  Eigen::
  TensorBase<Eigen::TensorReshapingOp<std::array<int,3ul>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>>,0>
  ::broadcast<std::array<int,3ul>>
            ((TensorBase<Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
              *)in_stack_fffffffffffffcb0,(array<int,_3UL> *)in_stack_fffffffffffffca8);
  Eigen::
  TensorBase<Eigen::TensorBroadcastingOp<const_std::array<int,_3UL>,_const_Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  ::operator-((TensorBase<Eigen::TensorBroadcastingOp<const_std::array<int,_3UL>,_const_Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
               *)in_stack_fffffffffffffcb8);
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const>,0>
  ::operator*(in_stack_fffffffffffffcc0._8_8_,in_stack_fffffffffffffcc0._0_8_);
  Tensor::tb<2>(in_stack_fffffffffffffcc0._0_8_);
  this_00 = in_stack_fffffffffffffcc0._0_8_;
  Eigen::
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const>const,Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::TensorBroadcastingOp<std::array<int,3ul>const,Eigen::TensorReshapingOp<std::array<int,3ul>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>>const>const>const>,0>
  ::operator+(in_stack_fffffffffffffcc0._8_8_,
              (TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> *)this_00);
  Tensor::tb<2>(this_00);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),in_RDI);
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator+=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  return;
}

Assistant:

void LogSoftmax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  Tensor z(Dim({xs[0]->d.cols()},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  // TODO? Is this broadcast efficient on CPU?
  Eigen::array<int, 1> red_axis; red_axis[0] = 0;
  z.tb<1>().device(*dev.edevice) = dEdf.tb<2>().sum(red_axis);
  Eigen::array<int, 3> bcast = {(int)fx.d.rows(), 1, 1};
  Eigen::array<int, 3> morph = {1, (int)z.d[0], (int)z.d.bd};
  dEdxi.tb<2>().device(*dev.edevice) += fx.tb<2>().exp() * -z.tvec().reshape(morph).broadcast(bcast) + dEdf.tb<2>();
}